

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaEnumBuilderPrivate::~QMetaEnumBuilderPrivate(QMetaEnumBuilderPrivate *this)

{
  QList<unsigned_long_long>::~QList((QList<unsigned_long_long> *)0x37a990);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x37a99e);
  QByteArray::~QByteArray((QByteArray *)0x37a9ac);
  QByteArray::~QByteArray((QByteArray *)0x37a9b6);
  return;
}

Assistant:

QMetaEnumBuilderPrivate(const QByteArray &_name)
        : name(_name), enumName(_name)
    {
    }